

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rect.h
# Opt level: O0

bool __thiscall DisjointRectCollection::Disjoint(DisjointRectCollection *this,Rect *r)

{
  bool bVar1;
  uint uVar2;
  Rect *a;
  uint local_24;
  uint i;
  Rect *r_local;
  DisjointRectCollection *this_local;
  
  if ((r->width != 0) && (r->height != 0)) {
    for (local_24 = 0; uVar2 = TArray<Rect,_Rect>::Size(&this->rects), local_24 < uVar2;
        local_24 = local_24 + 1) {
      a = TArray<Rect,_Rect>::operator[](&this->rects,(ulong)local_24);
      bVar1 = Disjoint(a,r);
      if (!bVar1) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool Disjoint(const Rect &r) const
	{
		// Degenerate rectangles are ignored.
		if (r.width == 0 || r.height == 0)
			return true;

		for(unsigned i = 0; i < rects.Size(); ++i)
			if (!Disjoint(rects[i], r))
				return false;
		return true;
	}